

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlFreeNode(xmlNodePtr cur)

{
  _xmlAttr *p_Var1;
  xmlAttrPtr cur_00;
  xmlElementType xVar2;
  int iVar3;
  xmlDeregisterNodeFunc *pp_Var4;
  xmlChar *str;
  _xmlNode *str_00;
  _xmlDict *dict;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  xVar2 = cur->type;
  if ((int)xVar2 < 0x11) {
    if (xVar2 == XML_ATTRIBUTE_NODE) {
      xmlFreeProp((xmlAttrPtr)cur);
      return;
    }
    if (xVar2 == XML_DTD_NODE) {
      xmlFreeDtd((xmlDtdPtr)cur);
      return;
    }
LAB_0014c48c:
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var4 = __xmlDeregisterNodeDefaultValue(), *pp_Var4 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var4 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var4)(cur);
    }
    if (cur->doc == (_xmlDoc *)0x0) {
      dict = (xmlDictPtr)0x0;
    }
    else {
      dict = cur->doc->dict;
    }
    xVar2 = cur->type;
    if (cur->children == (xmlNodePtr)0x0) {
LAB_0014c4f6:
      if ((xVar2 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
         ((0x180002U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
        cur_00 = cur->properties;
        while (cur_00 != (xmlAttrPtr)0x0) {
          p_Var1 = cur_00->next;
          xmlFreeProp(cur_00);
          cur_00 = p_Var1;
        }
        if (cur->nsDef != (xmlNsPtr)0x0) {
          xmlFreeNsList(cur->nsDef);
        }
      }
      else {
        str = cur->content;
        if ((_xmlAttr **)str != &cur->properties &&
            (xVar2 != XML_ENTITY_REF_NODE && str != (xmlChar *)0x0)) {
          if (dict != (xmlDictPtr)0x0) {
            iVar3 = xmlDictOwns(dict,str);
            if (iVar3 != 0) goto LAB_0014c570;
            str = cur->content;
          }
          (*xmlFree)(str);
        }
      }
    }
    else if (xVar2 != XML_ENTITY_REF_NODE) {
      xmlFreeNodeList(cur->children);
      xVar2 = cur->type;
      goto LAB_0014c4f6;
    }
LAB_0014c570:
    str_00 = (_xmlNode *)cur->name;
    if (((str_00 == (_xmlNode *)0x0) || (cur->type == XML_TEXT_NODE)) ||
       (cur->type == XML_COMMENT_NODE)) goto LAB_0014c597;
    if (dict != (xmlDictPtr)0x0) {
      iVar3 = xmlDictOwns(dict,(xmlChar *)str_00);
      if (iVar3 != 0) goto LAB_0014c597;
      str_00 = (_xmlNode *)cur->name;
    }
  }
  else {
    if (xVar2 == XML_ENTITY_DECL) {
      xmlFreeEntity((xmlEntityPtr)cur);
      return;
    }
    if (xVar2 != XML_NAMESPACE_DECL) goto LAB_0014c48c;
    if (cur->name != (xmlChar *)0x0) {
      (*xmlFree)(cur->name);
    }
    str_00 = cur->children;
    if (str_00 == (_xmlNode *)0x0) goto LAB_0014c597;
  }
  (*xmlFree)(str_00);
LAB_0014c597:
  (*xmlFree)(cur);
  return;
}

Assistant:

void
xmlFreeNode(xmlNodePtr cur) {
    xmlDictPtr dict = NULL;

    if (cur == NULL) return;

    /* use xmlFreeDtd for DTD nodes */
    if (cur->type == XML_DTD_NODE) {
	xmlFreeDtd((xmlDtdPtr) cur);
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNs((xmlNsPtr) cur);
        return;
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
	xmlFreeProp((xmlAttrPtr) cur);
	return;
    }
    if (cur->type == XML_ENTITY_DECL) {
        xmlFreeEntity((xmlEntityPtr) cur);
        return;
    }

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue(cur);

    if (cur->doc != NULL) dict = cur->doc->dict;

    if ((cur->children != NULL) &&
	(cur->type != XML_ENTITY_REF_NODE))
	xmlFreeNodeList(cur->children);

    if ((cur->type == XML_ELEMENT_NODE) ||
        (cur->type == XML_XINCLUDE_START) ||
        (cur->type == XML_XINCLUDE_END)) {
        if (cur->properties != NULL)
            xmlFreePropList(cur->properties);
        if (cur->nsDef != NULL)
            xmlFreeNsList(cur->nsDef);
    } else if ((cur->content != NULL) &&
               (cur->type != XML_ENTITY_REF_NODE) &&
               (cur->content != (xmlChar *) &(cur->properties))) {
        DICT_FREE(cur->content)
    }

    /*
     * When a node is a text node or a comment, it uses a global static
     * variable for the name of the node.
     * Otherwise the node name might come from the document's dictionary
     */
    if ((cur->name != NULL) &&
        (cur->type != XML_TEXT_NODE) &&
        (cur->type != XML_COMMENT_NODE))
	DICT_FREE(cur->name)

    xmlFree(cur);
}